

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O0

bool __thiscall table::updatecheck(table *this,UpdateStatement *stmt)

{
  bool bVar1;
  __type _Var2;
  bool bVar3;
  _Ios_Openmode _Var4;
  int iVar5;
  reference ppUVar6;
  column *pcVar7;
  ostream *poVar8;
  int *piVar9;
  reference ppcVar10;
  char *pcVar11;
  ulong uVar12;
  char *bytes_1;
  __mbstate_t local_358;
  column *local_350;
  column *col_2;
  iterator __end4_1;
  iterator __begin4_1;
  vector<column_*,_std::allocator<column_*>_> *__range4_1;
  column *tempcol_1;
  char *compareChar;
  string colName_1;
  char *bytes;
  __mbstate_t local_2f0;
  column *local_2e8;
  column *col_1;
  iterator __end4;
  iterator __begin4;
  vector<column_*,_std::allocator<column_*>_> *__range4;
  column *tempcol;
  string local_2b8 [4];
  int compareNum;
  string colName;
  int local_294;
  undefined1 local_290 [4];
  int i;
  char local_270 [8];
  fstream os;
  bool updated;
  allocator local_49;
  string local_48 [32];
  column *local_28;
  column *col;
  UpdateStatement *stmt_local;
  table *this_local;
  
  col = (column *)stmt;
  stmt_local = (UpdateStatement *)this;
  ppUVar6 = std::vector<hsql::UpdateClause_*,_std::allocator<hsql::UpdateClause_*>_>::operator[]
                      (stmt->updates,0);
  pcVar11 = (*ppUVar6)->column;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,pcVar11,&local_49);
  pcVar7 = getColumn(this,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  bVar3 = false;
  local_28 = pcVar7;
  if (pcVar7 == (column *)0x0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"no such column in table to update");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = 0;
  }
  else {
    if (*(long *)&col->field_0x20 != 0) {
      getName_abi_cxx11_((table *)local_290);
      _Var4 = std::operator|(_S_in,_S_out);
      _Var4 = std::operator|(_Var4,_S_bin);
      std::fstream::fstream(local_270,(string *)local_290,_Var4);
      std::__cxx11::string::~string((string *)local_290);
      for (local_294 = 0; iVar5 = getRowlength(this), local_294 < iVar5; local_294 = local_294 + 1)
      {
        if ((**(int **)(*(long *)&col->field_0x20 + 0x10) == 2) ||
           (**(int **)(*(long *)&col->field_0x20 + 8) == 2)) {
          std::__cxx11::string::string(local_2b8);
          if (**(int **)(*(long *)&col->field_0x20 + 0x10) == 2) {
            if (**(int **)(*(long *)&col->field_0x20 + 8) == 1) {
              poVar8 = std::operator<<((ostream *)&std::cout,
                                       "cannot do compare between int and char");
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              this_local._7_1_ = 0;
              tempcol._0_4_ = 1;
            }
            else {
              std::__cxx11::string::operator=
                        (local_2b8,*(char **)(*(long *)(*(long *)&col->field_0x20 + 8) + 0x28));
              tempcol._4_4_ =
                   (int)*(undefined8 *)(*(long *)(*(long *)&col->field_0x20 + 0x10) + 0x48);
LAB_00138a16:
              __range4 = (vector<column_*,_std::allocator<column_*>_> *)0x0;
              __end4 = std::vector<column_*,_std::allocator<column_*>_>::begin(&this->table_cols);
              col_1 = (column *)
                      std::vector<column_*,_std::allocator<column_*>_>::end(&this->table_cols);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end4,(__normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>
                                                 *)&col_1), bVar1) {
                ppcVar10 = __gnu_cxx::
                           __normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>
                           ::operator*(&__end4);
                local_2e8 = *ppcVar10;
                _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_2b8,&local_2e8->name);
                if (_Var2) {
                  __range4 = (vector<column_*,_std::allocator<column_*>_> *)local_2e8;
                }
                __gnu_cxx::
                __normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>::
                operator++(&__end4);
              }
              if (__range4 == (vector<column_*,_std::allocator<column_*>_> *)0x0) {
                poVar8 = std::operator<<((ostream *)&std::cout,"column ");
                poVar8 = std::operator<<(poVar8,local_2b8);
                poVar8 = std::operator<<(poVar8," do not exist in table");
                std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                this_local._7_1_ = 0;
                tempcol._0_4_ = 1;
              }
              else {
                iVar5 = getrowSize(this);
                std::fpos<__mbstate_t>::fpos
                          ((fpos<__mbstate_t> *)&bytes,
                           (long)(local_294 * iVar5 +
                                 *(int *)&(__range4->
                                          super__Vector_base<column_*,_std::allocator<column_*>_>).
                                          _M_impl.super__Vector_impl_data._M_start));
                std::istream::seekg(local_270,bytes,local_2f0);
                uVar12 = (ulong)*(int *)&(__range4->
                                         super__Vector_base<column_*,_std::allocator<column_*>_>).
                                         _M_impl.super__Vector_impl_data._M_finish;
                if ((long)uVar12 < 0) {
                  uVar12 = 0xffffffffffffffff;
                }
                piVar9 = (int *)operator_new__(uVar12);
                std::istream::read(local_270,(long)piVar9);
                if (*(char *)(*(long *)&col->field_0x20 + 0x5c) == '=') {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)(__range4 + 2),"CHAR");
                  if (bVar1) {
                    poVar8 = std::operator<<((ostream *)&std::cout,
                                             "cannot do = for char columns with int value");
                    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                    if (piVar9 != (int *)0x0) {
                      operator_delete(piVar9);
                    }
                    this_local._7_1_ = 0;
                    tempcol._0_4_ = 1;
                  }
                  else {
                    if (*piVar9 == tempcol._4_4_) goto LAB_00138ceb;
                    if (piVar9 != (int *)0x0) {
                      operator_delete(piVar9);
                    }
                    tempcol._0_4_ = 4;
                  }
                }
                else {
LAB_00138ceb:
                  if (*(char *)(*(long *)&col->field_0x20 + 0x5c) == '>') {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)(__range4 + 2),"CHAR");
                    if (bVar1) {
                      poVar8 = std::operator<<((ostream *)&std::cout,
                                               "cannot do > for char columns with int value");
                      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                      if (piVar9 != (int *)0x0) {
                        operator_delete(piVar9);
                      }
                      this_local._7_1_ = 0;
                      tempcol._0_4_ = 1;
                    }
                    else {
                      if (tempcol._4_4_ < *piVar9) goto LAB_00138dd1;
                      if (piVar9 != (int *)0x0) {
                        operator_delete(piVar9);
                      }
                      tempcol._0_4_ = 4;
                    }
                  }
                  else {
LAB_00138dd1:
                    if (*(char *)(*(long *)&col->field_0x20 + 0x5c) == '<') {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(__range4 + 2),"CHAR");
                      if (bVar1) {
                        poVar8 = std::operator<<((ostream *)&std::cout,
                                                 "cannot do < for char columns with int value");
                        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                        if (piVar9 != (int *)0x0) {
                          operator_delete(piVar9);
                        }
                        this_local._7_1_ = 0;
                        tempcol._0_4_ = 1;
                      }
                      else {
                        if (*piVar9 < tempcol._4_4_) goto LAB_00138eb1;
                        if (piVar9 != (int *)0x0) {
                          operator_delete(piVar9);
                        }
                        tempcol._0_4_ = 4;
                      }
                    }
                    else {
LAB_00138eb1:
                      tempcol._0_4_ = 0;
                    }
                  }
                }
              }
            }
          }
          else {
            if (**(int **)(*(long *)&col->field_0x20 + 0x10) != 1) {
              std::__cxx11::string::operator=
                        (local_2b8,*(char **)(*(long *)(*(long *)&col->field_0x20 + 0x10) + 0x28));
              tempcol._4_4_ = (int)*(undefined8 *)(*(long *)(*(long *)&col->field_0x20 + 8) + 0x48);
              goto LAB_00138a16;
            }
            poVar8 = std::operator<<((ostream *)&std::cout,"cannot do compare between int and char")
            ;
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            this_local._7_1_ = 0;
            tempcol._0_4_ = 1;
          }
          std::__cxx11::string::~string(local_2b8);
          if ((int)tempcol == 0) goto LAB_00138eef;
          if ((int)tempcol != 4) goto LAB_001393d1;
        }
        else {
LAB_00138eef:
          if ((**(int **)(*(long *)&col->field_0x20 + 8) != 5) ||
             (**(int **)(*(long *)&col->field_0x20 + 0x10) != 5)) {
            if ((**(int **)(*(long *)&col->field_0x20 + 0x10) == 1) ||
               (**(int **)(*(long *)&col->field_0x20 + 8) == 1)) {
              std::__cxx11::string::string((string *)&compareChar);
              if (**(int **)(*(long *)&col->field_0x20 + 0x10) == 1) {
                std::__cxx11::string::operator=
                          ((string *)&compareChar,
                           *(char **)(*(long *)(*(long *)&col->field_0x20 + 8) + 0x28));
                tempcol_1 = *(column **)(*(long *)(*(long *)&col->field_0x20 + 0x10) + 0x28);
              }
              else {
                std::__cxx11::string::operator=
                          ((string *)&compareChar,
                           *(char **)(*(long *)(*(long *)&col->field_0x20 + 0x10) + 0x28));
                tempcol_1 = *(column **)(*(long *)(*(long *)&col->field_0x20 + 8) + 0x28);
              }
              __range4_1 = (vector<column_*,_std::allocator<column_*>_> *)0x0;
              __end4_1 = std::vector<column_*,_std::allocator<column_*>_>::begin(&this->table_cols);
              col_2 = (column *)
                      std::vector<column_*,_std::allocator<column_*>_>::end(&this->table_cols);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end4_1,
                                        (__normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>
                                         *)&col_2), bVar1) {
                ppcVar10 = __gnu_cxx::
                           __normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>
                           ::operator*(&__end4_1);
                local_350 = *ppcVar10;
                _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&compareChar,&local_350->name);
                if (_Var2) {
                  __range4_1 = (vector<column_*,_std::allocator<column_*>_> *)local_350;
                }
                __gnu_cxx::
                __normal_iterator<column_**,_std::vector<column_*,_std::allocator<column_*>_>_>::
                operator++(&__end4_1);
              }
              if (__range4_1 == (vector<column_*,_std::allocator<column_*>_> *)0x0) {
                poVar8 = std::operator<<((ostream *)&std::cout,"column ");
                poVar8 = std::operator<<(poVar8,(string *)&compareChar);
                poVar8 = std::operator<<(poVar8," do not exist in table");
                std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
                this_local._7_1_ = 0;
                tempcol._0_4_ = 1;
              }
              else {
                iVar5 = getrowSize(this);
                std::fpos<__mbstate_t>::fpos
                          ((fpos<__mbstate_t> *)&bytes_1,
                           (long)(local_294 * iVar5 +
                                 *(int *)&(__range4_1->
                                          super__Vector_base<column_*,_std::allocator<column_*>_>).
                                          _M_impl.super__Vector_impl_data._M_start));
                std::istream::seekg(local_270,bytes_1,local_358);
                uVar12 = (ulong)*(int *)&(__range4_1->
                                         super__Vector_base<column_*,_std::allocator<column_*>_>).
                                         _M_impl.super__Vector_impl_data._M_finish;
                if ((long)uVar12 < 0) {
                  uVar12 = 0xffffffffffffffff;
                }
                pcVar11 = (char *)operator_new__(uVar12);
                std::istream::read(local_270,(long)pcVar11);
                if (*(char *)(*(long *)&col->field_0x20 + 0x5c) == '=') {
                  bVar1 = util::compareString(pcVar11,(char *)tempcol_1);
                  if (bVar1) goto LAB_0013930b;
                  if (pcVar11 != (char *)0x0) {
                    operator_delete(pcVar11);
                  }
                  tempcol._0_4_ = 4;
                }
                else if (*(char *)(*(long *)&col->field_0x20 + 0x5c) == '>') {
                  iVar5 = util::compareChar(pcVar11,(char *)tempcol_1);
                  if (iVar5 == 1) {
LAB_0013930b:
                    tempcol._0_4_ = 0;
                  }
                  else {
                    if (pcVar11 != (char *)0x0) {
                      operator_delete(pcVar11);
                    }
                    tempcol._0_4_ = 4;
                  }
                }
                else {
                  if ((*(char *)(*(long *)&col->field_0x20 + 0x5c) != '<') ||
                     (iVar5 = util::compareChar(pcVar11,(char *)tempcol_1), iVar5 == -1))
                  goto LAB_0013930b;
                  if (pcVar11 != (char *)0x0) {
                    operator_delete(pcVar11);
                  }
                  tempcol._0_4_ = 4;
                }
              }
              std::__cxx11::string::~string((string *)&compareChar);
              if ((int)tempcol != 0) {
                if ((int)tempcol == 4) goto LAB_001393a5;
                goto LAB_001393d1;
              }
            }
            if (local_28 != (column *)0x0) {
              bVar3 = std::operator==(&local_28->flag,"CHAR");
              if (bVar3) {
                std::vector<hsql::UpdateClause_*,_std::allocator<hsql::UpdateClause_*>_>::operator[]
                          (*(vector<hsql::UpdateClause_*,_std::allocator<hsql::UpdateClause_*>_> **)
                            &col->field_0x18,0);
              }
              bVar3 = true;
            }
          }
        }
LAB_001393a5:
      }
      std::fstream::close();
      tempcol._0_4_ = 0;
LAB_001393d1:
      std::fstream::~fstream(local_270);
      if ((int)tempcol != 0) goto LAB_0013942d;
    }
    if (bVar3) {
      this_local._7_1_ = 1;
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,"where condition is wrong");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = 0;
    }
  }
LAB_0013942d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool table::updatecheck(hsql::UpdateStatement *stmt) {
    column* col = getColumn((*stmt->updates)[0]->column);
    bool updated = false;
    if(col == NULL){
        cout << "no such column in table to update" <<endl;
        return false;
    }
    if(stmt->where == nullptr){
        //set all column to same value
    }
    else {
        fstream os(getName(), ios::in|ios::out|ios::binary);

        for (int i = 0; i < getRowlength(); i++) {
            if (stmt->where->expr2->type == hsql::kExprLiteralInt || stmt->where->expr->type == hsql::kExprLiteralInt) {
                //select column
                string colName;
                int compareNum;
                if (stmt->where->expr2->type == hsql::kExprLiteralInt) {
                    if (stmt->where->expr->type == hsql::kExprLiteralString) {
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->where->expr->name;
                    compareNum = (int) stmt->where->expr2->ival;
                } else {
                    if (stmt->where->expr2->type == hsql::kExprLiteralString) {
                        cout << "cannot do compare between int and char" << endl;
                        return false;
                    }
                    colName = stmt->where->expr2->name;
                    compareNum = (int) stmt->where->expr->ival;
                }
                column *tempcol = NULL;
                //check if table have this column
                for (auto col: table_cols) {
                    if (colName == col->name) {
                        tempcol = col;
                    }
                }
                if (tempcol == NULL) {
                    cout << "column " << colName << " do not exist in table" << endl;
                    return false;
                }
                //get column value
                os.seekg(i * getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if (stmt->where->opChar == '=') {
                    if (tempcol->flag == "CHAR") {
                        cout << "cannot do = for char columns with int value" << endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes != compareNum) {
                        delete bytes;
                        continue;
                    }
                }
                //check >
                if (stmt->where->opChar == '>') {
                    if (tempcol->flag == "CHAR") {
                        cout << "cannot do > for char columns with int value" << endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes <= compareNum) {
                        delete bytes;
                        continue;
                    }
                }
                //check <
                if (stmt->where->opChar == '<') {
                    if (tempcol->flag == "CHAR") {
                        cout << "cannot do < for char columns with int value" << endl;
                        delete bytes;
                        return false;
                    }
                    if (*(int *) bytes >= compareNum) {
                        delete bytes;
                        continue;
                    }
                }

            }
            if (stmt->where->expr->type == hsql::kExprColumnRef && stmt->where->expr2->type == hsql::kExprColumnRef)
                continue;
            //do char
            if (stmt->where->expr2->type == hsql::kExprLiteralString ||
                stmt->where->expr->type == hsql::kExprLiteralString) {
                //select column
                string colName;
                char *compareChar;
                if (stmt->where->expr2->type == hsql::kExprLiteralString) {
                    colName = stmt->where->expr->name;
                    compareChar = stmt->where->expr2->name;
                } else {
                    colName = stmt->where->expr2->name;
                    compareChar = stmt->where->expr->name;
                }
                column *tempcol = NULL;
                //check if table have this column
                for (auto col: table_cols) {
                    if (colName == col->name) {
                        tempcol = col;
                    }
                }
                if (tempcol == NULL) {
                    cout << "column " << colName << " do not exist in table" << endl;
                    return false;
                }
                //get column value
                os.seekg(i * getrowSize() + tempcol->col_offset);
                char *bytes = new char[tempcol->element_truesize];
                os.read(bytes, tempcol->element_truesize);
                //check =
                if (stmt->where->opChar == '=') {
                    if (!util::compareString(bytes, compareChar)) {
                        delete bytes;
                        continue;
                    }
                }
                    //check >
                else if (stmt->where->opChar == '>') {
                    if (util::compareChar(bytes, compareChar) != 1) {
                        delete bytes;
                        continue;
                    }
                }
                    //check <
                else if (stmt->where->opChar == '<') {
                    if (util::compareChar(bytes, compareChar) != -1) {
                        delete bytes;
                        continue;
                    }
                }

            }
            //do update

            if (col != NULL) {

                if (col->flag == "CHAR") {
                    if (((*stmt->updates)[0]->value)->type == hsql::kExprLiteralString) {

                        updated = true;

                    } else {

                        updated = true;
                    }
                } else {

                    updated = true;

                }
            }

        }
        os.close();
    }
    if(updated)
        return true;
    else{
        cout<<"where condition is wrong"<<endl;
        return false;
    }

}